

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StackSwitch *curr,
          optional<wasm::HeapType> ct)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Type *pTVar4;
  size_t i;
  ulong index;
  Signature SVar5;
  HeapType local_60;
  Type local_58;
  StackSwitch *local_50;
  Type local_48;
  Type params;
  optional<wasm::HeapType> ct_local;
  
  params.id = ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload;
  if (((undefined1  [16])
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    params.id = (uintptr_t)wasm::Type::getHeapType(&curr->cont->type);
  }
  bVar1 = HeapType::isContinuation((HeapType *)&params);
  if (bVar1) {
    local_60.id = (uintptr_t)HeapType::getContinuation((HeapType *)&params);
    SVar5 = HeapType::getSignature(&local_60);
    local_48 = SVar5.params.id;
    sVar2 = wasm::Type::size(&local_48);
    if (sVar2 != 0) {
      sVar2 = wasm::Type::size(&local_48);
      if (sVar2 - 1 ==
          (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements) {
        index = 0;
        local_50 = curr;
        while( true ) {
          sVar2 = wasm::Type::size(&local_48);
          if (sVar2 - 1 <= index) break;
          ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(curr->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,index);
          pTVar4 = wasm::Type::operator[](&local_48,index);
          IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                    ((ConstraintCollector *)this,ppEVar3,(Type)pTVar4->id);
          index = index + 1;
        }
        ppEVar3 = &local_50->cont;
        wasm::Type::Type(&local_58,(HeapType)params.id,Nullable,Inexact);
        IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                  ((ConstraintCollector *)this,ppEVar3,local_58);
        return;
      }
    }
    __assert_fail("params.size() >= 1 && ((params.size() - 1) == curr->operands.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x48d,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch(StackSwitch *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  __assert_fail("ct->isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x48a,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch(StackSwitch *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitStackSwitch(StackSwitch* curr,
                        std::optional<HeapType> ct = std::nullopt) {
    if (!ct.has_value()) {
      ct = curr->cont->type.getHeapType();
    }
    assert(ct->isContinuation());
    auto params = ct->getContinuation().type.getSignature().params;
    assert(params.size() >= 1 &&
           ((params.size() - 1) == curr->operands.size()));
    for (size_t i = 0; i < params.size() - 1; ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->cont, Type(*ct, Nullable));
  }